

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall ParseTest_ParseLine_Test::ParseTest_ParseLine_Test(ParseTest_ParseLine_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_ParseTest).super_Test._vptr_Test = (_func_int **)&PTR__ParseTest_0013c290;
  parse::Parse::Parse(&(this->super_ParseTest)._parse);
  (this->super_ParseTest)._test_input._M_dataplus._M_p =
       (pointer)&(this->super_ParseTest)._test_input.field_2;
  (this->super_ParseTest)._test_input._M_string_length = 0;
  (this->super_ParseTest)._test_input.field_2._M_local_buf[0] = '\0';
  (this->super_ParseTest).super_Test._vptr_Test = (_func_int **)&PTR__ParseTest_0013c070;
  return;
}

Assistant:

TEST_F(ParseTest, ParseLine) {
    test_parse_line(&_parse);
}